

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_unique_ptr.hpp
# Opt level: O0

unique_ptr<Catch::Generators::SingleValueGenerator<float>_> __thiscall
Catch::Detail::make_unique<Catch::Generators::SingleValueGenerator<float>,float>
          (Detail *this,float *args)

{
  SingleValueGenerator<float> *this_00;
  float *args_local;
  
  this_00 = (SingleValueGenerator<float> *)operator_new(0x38);
  Catch::Generators::SingleValueGenerator<float>::SingleValueGenerator(this_00,args);
  unique_ptr<Catch::Generators::SingleValueGenerator<float>_>::unique_ptr
            ((unique_ptr<Catch::Generators::SingleValueGenerator<float>_> *)this,this_00);
  return (unique_ptr<Catch::Generators::SingleValueGenerator<float>_>)
         (SingleValueGenerator<float> *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }